

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.c
# Opt level: O0

void ppu_end_hblank(gba_ppu_t *ppu)

{
  short *in_RDI;
  
  if ((dbg_window_visible) && (tick_on == SCANLINE)) {
    actual_dbg_tick();
  }
  *(int *)(in_RDI + 0x1f658) = (int)in_RDI[0x1f636] + *(int *)(in_RDI + 0x1f658);
  *(int *)(in_RDI + 0x1f660) = (int)in_RDI[0x1f63e] + *(int *)(in_RDI + 0x1f660);
  *(int *)(in_RDI + 0x1f65c) = (int)in_RDI[0x1f63a] + *(int *)(in_RDI + 0x1f65c);
  *(int *)(in_RDI + 0x1f664) = (int)in_RDI[0x1f642] + *(int *)(in_RDI + 0x1f664);
  in_RDI[0x1f666] = in_RDI[0x1f666] & 0xfffd;
  *in_RDI = *in_RDI + 1;
  check_vcount((gba_ppu_t *)0x15e175);
  return;
}

Assistant:

void ppu_end_hblank(gba_ppu_t* ppu) {
    dbg_tick(SCANLINE);

    ppu->BG2X.current.sraw += ppu->BG2PB.sraw;
    ppu->BG3X.current.sraw += ppu->BG3PB.sraw;
    ppu->BG2Y.current.sraw += ppu->BG2PD.sraw;
    ppu->BG3Y.current.sraw += ppu->BG3PD.sraw;

    ppu->DISPSTAT.hblank = false;
    ppu->y++;

    check_vcount(ppu);
}